

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void MakeRandDeterministicDANGEROUS(uint256 *seed)

{
  long lVar1;
  long in_FS_OFFSET;
  uint256 *unaff_retaddr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_41304e::GetRNGState();
  anon_unknown.dwarf_41304e::RNGState::MakeDeterministic((RNGState *)seed,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakeRandDeterministicDANGEROUS(const uint256& seed) noexcept
{
    GetRNGState().MakeDeterministic(seed);
}